

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main)

{
  undefined8 *puVar1;
  int *piVar2;
  WebPConfig *pWVar3;
  WebPPicture *pic;
  uint *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  WebPWorker *pWVar7;
  WebPWorker *pWVar8;
  WebPWorker *pWVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  VP8LEncoder *enc;
  WebPWorkerInterface *pWVar15;
  uint32_t *ptr;
  uint64_t uVar16;
  undefined8 uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  undefined1 *puVar21;
  uint uVar22;
  uint *puVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int in_R8D;
  int in_R9D;
  uint *puVar29;
  ulong uVar30;
  int iVar31;
  undefined4 uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint32_t *array;
  ulong *puVar36;
  uint uVar37;
  WebPWorker *pWVar38;
  bool bVar39;
  bool bVar40;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  CrunchConfig crunch_configs [14];
  StreamEncodeContext params_side;
  WebPPicture picture_side;
  WebPAuxStats stats_side;
  VP8LEncoder *local_7f8;
  undefined4 local_7f0;
  VP8LBitWriter local_788;
  WebPWorker local_758;
  WebPWorker local_728;
  uint64_t local_6f8;
  WebPPicture *pWStack_6f0;
  VP8LBitWriter *local_6e8;
  VP8LEncoder *pVStack_6e0;
  long local_6d8;
  long lStack_6d0;
  long local_6c8;
  long lStack_6c0;
  long local_6b8;
  long lStack_6b0;
  long local_6a8;
  long lStack_6a0;
  long local_698;
  int local_550;
  WebPAuxStats *local_548;
  uint local_538 [2];
  undefined1 auStack_530 [12];
  undefined8 uStack_524;
  undefined8 local_51c;
  ulong local_3a8;
  WebPPicture *pWStack_3a0;
  VP8LBitWriter *local_398;
  VP8LEncoder *pVStack_390;
  long local_388;
  undefined8 auStack_37c [47];
  uint local_200;
  WebPAuxStats *local_1f8;
  WebPPicture local_1f0;
  WebPAuxStats local_ec;
  
  enc = VP8LEncoderNew(config,picture);
  pWVar15 = WebPGetWorkerInterface();
  if ((enc == (VP8LEncoder *)0x0) || (iVar10 = VP8LBitWriterInit(&local_788,0), iVar10 == 0)) {
    VP8LEncoderDelete(enc);
    iVar10 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar10;
  }
  iVar10 = WebPPictureInitInternal(&local_1f0,0x210);
  local_7f8 = (VP8LEncoder *)0x0;
  if (iVar10 == 0) goto LAB_0013e34f;
  pWVar3 = enc->config;
  pic = enc->pic;
  iVar10 = pWVar3->method;
  uVar33 = pic->width;
  uVar19 = (ulong)uVar33;
  iVar31 = pic->height;
  uVar35 = 6;
  if (3 < iVar10) {
    uVar35 = iVar10 == 4 | 4;
  }
  iVar11 = GetColorPalette(pic,enc->palette_sorted);
  iVar24 = 0;
  if (iVar11 < 0x101) {
    iVar24 = iVar11;
  }
  enc->palette_size = iVar24;
  uVar12 = ClampBits(pic->width,pic->height,((uint)(iVar11 < 0x101) * 2 - iVar10) + 7,0xa28,in_R8D,
                     in_R9D);
  if ((int)uVar12 <= (int)uVar35) {
    uVar35 = uVar12;
  }
  enc->histo_bits = uVar12;
  enc->predictor_transform_bits = uVar35;
  enc->cross_color_transform_bits = uVar35;
  if (iVar10 == 0) {
    local_538[0] = (iVar11 < 0x101) + 3;
    local_538[1] = (uint)(0x100 < iVar11) * 3;
    local_7f0 = 0;
    uVar19 = 1;
    uVar30 = 1;
    uVar32 = 0;
LAB_0013e245:
    if (0 < (int)uVar19) {
      puVar21 = auStack_530 + 4;
      uVar25 = 0;
      do {
        uVar28 = 0;
        do {
          *(uint *)(puVar21 + uVar28 * 8 + -4) = 4 - (uint)(uVar28 == 0);
          *(undefined4 *)(puVar21 + uVar28 * 8) = uVar32;
          uVar28 = uVar28 + 1;
        } while (uVar30 != uVar28);
        *(int *)((long)&uStack_524 + uVar25 * 0x1c + 4) = (int)uVar30;
        uVar25 = uVar25 + 1;
        puVar21 = puVar21 + 0x1c;
      } while (uVar25 != uVar19);
    }
    bVar39 = false;
  }
  else {
    local_7f0 = 1;
    uVar12 = (iVar24 < 0x11) + 1;
    if (iVar24 < 1) {
      uVar12 = 1;
    }
    uVar32 = 0;
    if (iVar11 < 0x101 && iVar24 < 0x11) {
      uVar35 = 4;
LAB_0013e0f0:
      bVar40 = false;
    }
    else {
      puVar4 = pic->argb;
      iVar20 = pic->argb_stride;
      ptr = (uint32_t *)WebPSafeCalloc(0xd,0x400);
      if (ptr != (uint32_t *)0x0) {
        if (0 < iVar31) {
          uVar37 = *puVar4;
          iVar14 = 0;
          puVar29 = (uint *)0x0;
          do {
            puVar23 = puVar4;
            if (0 < (int)uVar33) {
              uVar30 = 0;
              uVar13 = uVar37;
              do {
                uVar37 = puVar23[uVar30];
                uVar34 = (uVar37 | 0xff0000) - (uVar13 & 0xff00ff00);
                uVar13 = (uVar37 | 0xff00) - (uVar13 & 0xff00ff);
                uVar22 = uVar13 & 0xff00ff | uVar34 & 0xff00ff00;
                if ((uVar22 != 0) && ((puVar29 == (uint *)0x0 || (uVar37 != puVar29[uVar30])))) {
                  ptr[uVar37 >> 0x18] = ptr[uVar37 >> 0x18] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)(uVar37 >> 0xe & 0x3fc) + 0x1000);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar37 >> 8 & 0xff) + 0x200] =
                       ptr[(ulong)(uVar37 >> 8 & 0xff) + 0x200] + 1;
                  ptr[(ulong)(uVar37 & 0xff) + 0x600] = ptr[(ulong)(uVar37 & 0xff) + 0x600] + 1;
                  ptr[(ulong)(uVar34 >> 0x18) + 0x100] = ptr[(ulong)(uVar34 >> 0x18) + 0x100] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)((uVar13 & 0xff0000) >> 0xe) + 0x1400);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar34 >> 8 & 0xff) + 0x300] =
                       ptr[(ulong)(uVar34 >> 8 & 0xff) + 0x300] + 1;
                  ptr[(ulong)(uVar13 & 0xff) + 0x700] = ptr[(ulong)(uVar13 & 0xff) + 0x700] + 1;
                  ptr[(ulong)((uVar37 >> 0x10) - ((int)uVar37 >> 8) & 0xff) + 0x800] =
                       ptr[(ulong)((uVar37 >> 0x10) - ((int)uVar37 >> 8) & 0xff) + 0x800] + 1;
                  ptr[(ulong)(uVar37 - ((int)uVar37 >> 8) & 0xff) + 0xa00] =
                       ptr[(ulong)(uVar37 - ((int)uVar37 >> 8) & 0xff) + 0xa00] + 1;
                  ptr[(ulong)((uVar22 >> 0x10) - ((int)uVar22 >> 8) & 0xff) + 0x900] =
                       ptr[(ulong)((uVar22 >> 0x10) - ((int)uVar22 >> 8) & 0xff) + 0x900] + 1;
                  ptr[(ulong)(uVar13 - ((int)uVar22 >> 8) & 0xff) + 0xb00] =
                       ptr[(ulong)(uVar13 - ((int)uVar22 >> 8) & 0xff) + 0xb00] + 1;
                  piVar2 = (int *)((long)ptr +
                                  (ulong)(((uVar37 >> 0x13) + uVar37) * 0x39c5fba7 >> 0x16 &
                                         0xfffffffc) + 0x3000);
                  *piVar2 = *piVar2 + 1;
                }
                uVar30 = uVar30 + 1;
                uVar13 = uVar37;
              } while (uVar19 != uVar30);
            }
            iVar14 = iVar14 + 1;
            puVar4 = puVar23 + iVar20;
            puVar29 = puVar23;
          } while (iVar14 != iVar31);
        }
        ptr[0x900] = ptr[0x900] + 1;
        ptr[0xb00] = ptr[0xb00] + 1;
        ptr[0x500] = ptr[0x500] + 1;
        ptr[0x300] = ptr[0x300] + 1;
        ptr[0x700] = ptr[0x700] + 1;
        ptr[0x100] = ptr[0x100] + 1;
        lVar26 = 0;
        array = ptr;
        do {
          uVar16 = VP8LBitsEntropy(array,0x100);
          (&local_6f8)[lVar26] = uVar16;
          lVar26 = lVar26 + 1;
          array = array + 0x100;
        } while (lVar26 != 0xd);
        local_3a8 = (long)&local_6e8->bits + local_6c8 + local_6d8 + local_6f8;
        bVar18 = (byte)uVar35;
        iVar20 = 1 << (bVar18 & 0x1f);
        local_398 = (VP8LBitWriter *)((long)&local_6e8->bits + local_6a8 + local_6b8 + local_6f8);
        lVar26 = (ulong)((iVar20 + iVar31) - 1U >> (bVar18 & 0x1f)) *
                 (ulong)((uVar33 + iVar20) - 1 >> (bVar18 & 0x1f));
        pWStack_3a0 = (WebPPicture *)
                      ((long)pWStack_6f0 +
                      (long)pVStack_6e0->palette +
                      lVar26 * 0x1e75768 + lStack_6c0 + lStack_6d0 + -0x68);
        pVStack_390 = (VP8LEncoder *)
                      ((long)pWStack_6f0 +
                      (long)pVStack_6e0->palette +
                      lVar26 * 0x24ae00d + lStack_6a0 + lStack_6b0 + -0x68);
        local_388 = (long)iVar24 * 0x4000000 + local_698;
        uVar30 = 1;
        uVar35 = 0;
        uVar33 = 0;
        do {
          uVar25 = uVar30 & 0xffffffff;
          uVar37 = (uint)uVar30;
          if ((&local_3a8)[uVar33] <= (&local_3a8)[uVar30]) {
            uVar25 = (ulong)uVar35;
            uVar37 = uVar33;
          }
          uVar33 = uVar37;
          uVar30 = uVar30 + 1;
          uVar35 = (uint)uVar25;
        } while (((ulong)(iVar11 < 0x101) | 4) != uVar30);
        lVar26 = 1;
        do {
          if (ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar25 * 2 + 1] * 0x100 + lVar26] != 0 ||
              ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar25 * 2] * 0x100 + lVar26] != 0) {
            local_7f0 = 0;
            goto LAB_0013e0e8;
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x100);
        local_7f0 = 1;
LAB_0013e0e8:
        WebPSafeFree(ptr);
        goto LAB_0013e0f0;
      }
      bVar40 = true;
      local_7f0 = 0;
    }
    uVar30 = (ulong)uVar12;
    if (!bVar40) {
      if (((iVar10 != 6) || (pWVar3->quality != 100.0)) || (NAN(pWVar3->quality))) {
        local_538[1] = (uint)(0x100 < iVar11) * 2 + 1;
        uVar19 = 1;
        local_538[0] = uVar35;
        if (iVar10 == 5 && 75.0 <= pWVar3->quality) {
          uVar32 = 1;
          if (uVar35 == 4) {
            local_51c = 0x100000005;
            uVar19 = 2;
          }
          else {
            uVar19 = 1;
          }
        }
      }
      else {
        uVar19 = 0;
        uVar33 = 0;
        do {
          if (iVar11 < 0x101 || uVar33 < 4) {
            if ((uVar33 & 6) == 4 && iVar11 < 0x101) {
              iVar10 = 0;
              do {
                if ((iVar10 != 0) && (iVar10 != 3)) {
                  iVar31 = (int)uVar19;
                  local_538[(long)iVar31 * 7] = uVar33;
                  *(int *)(auStack_530 + (long)iVar31 * 0x1c + -4) = iVar10;
                  uVar19 = (ulong)(iVar31 + 1);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 != 4);
            }
            else {
              iVar10 = (int)uVar19;
              local_538[(long)iVar10 * 7] = uVar33;
              *(undefined4 *)(auStack_530 + (long)iVar10 * 0x1c + -4) = 3;
              uVar19 = (ulong)(iVar10 + 1);
            }
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != 6);
        uVar32 = 1;
      }
    }
    bVar39 = true;
    if (!bVar40) goto LAB_0013e245;
  }
  if ((!bVar39) && (iVar10 = EncoderInit(enc), iVar10 != 0)) {
    iVar10 = (int)uVar19;
    if (config->thread_level < 1) {
      uVar33 = 0;
    }
    else {
      uVar33 = (int)(uVar19 >> 0x1f) + iVar10 >> 1;
      local_200 = uVar33;
      if (1 < iVar10) {
        uVar19 = (ulong)uVar33;
        lVar26 = (long)iVar10 * 0x1c + (long)(int)uVar33 * -0x1c;
        lVar27 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_538 + lVar27 + lVar26);
          uVar17 = *puVar1;
          uVar5 = puVar1[1];
          uVar6 = *(undefined8 *)((long)(auStack_530 + lVar27 + lVar26 + 4) + 8);
          *(undefined8 *)((long)auStack_37c + lVar27) =
               *(undefined8 *)(auStack_530 + lVar27 + lVar26 + 4);
          *(undefined8 *)((long)auStack_37c + lVar27 + 8) = uVar6;
          *(undefined8 *)((long)&local_388 + lVar27) = uVar17;
          *(undefined8 *)(&stack0xfffffffffffffc80 + lVar27) = uVar5;
          lVar27 = lVar27 + 0x1c;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
    }
    if (iVar10 - uVar33 != 0 && (int)uVar33 <= iVar10) {
      memcpy(&local_6d8,local_538,(ulong)(iVar10 + ~uVar33) * 0x1c + 0x1c);
    }
    iVar31 = 0;
    local_7f8 = (VP8LEncoder *)0x0;
    local_550 = iVar10 - uVar33;
    do {
      bVar40 = iVar31 == 0;
      pWVar38 = &local_758;
      if (bVar40) {
        pWVar38 = &local_728;
      }
      puVar36 = &local_3a8;
      if (bVar40) {
        puVar36 = &local_6f8;
      }
      *puVar36 = (ulong)config;
      *(undefined4 *)((long)puVar36 + 0x1ac) = local_7f0;
      if (bVar40) {
        local_548 = picture->stats;
        pWVar7 = &local_728;
        pWVar8 = &local_728;
        pWVar9 = &local_728;
        pWStack_6f0 = picture;
        local_6e8 = bw_main;
        pVStack_6e0 = enc;
LAB_0013e57c:
        (*pWVar15->Init)(pWVar38);
        pWVar7->data1 = puVar36;
        pWVar8->data2 = (void *)0x0;
        pWVar9->hook = EncodeStreamHook;
        bVar40 = false;
        uVar17 = 0x13e801;
      }
      else {
        WebPPictureView(picture,0,0,picture->width,picture->height,&local_1f0);
        local_1f0.progress_hook = (WebPProgressHook)0x0;
        local_1f8 = picture->stats;
        if (picture->stats != (WebPAuxStats *)0x0) {
          local_1f8 = &local_ec;
        }
        pWStack_3a0 = &local_1f0;
        iVar10 = VP8LBitWriterClone(bw_main,&local_788);
        if (iVar10 == 0) {
          WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
          bVar40 = true;
          uVar17 = 0;
        }
        else {
          local_398 = &local_788;
          local_7f8 = VP8LEncoderNew(config,&local_1f0);
          if ((local_7f8 != (VP8LEncoder *)0x0) && (iVar10 = EncoderInit(local_7f8), iVar10 != 0)) {
            iVar10 = enc->predictor_transform_bits;
            local_7f8->histo_bits = enc->histo_bits;
            local_7f8->predictor_transform_bits = iVar10;
            local_7f8->cross_color_transform_bits = enc->cross_color_transform_bits;
            local_7f8->palette_size = enc->palette_size;
            memcpy(local_7f8->palette,enc->palette,0x400);
            memcpy(local_7f8->palette_sorted,enc->palette_sorted,0x400);
            pWVar7 = &local_758;
            pWVar8 = &local_758;
            pWVar9 = &local_758;
            pVStack_390 = local_7f8;
            goto LAB_0013e57c;
          }
          WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
          bVar40 = true;
          uVar17 = 0;
        }
      }
      iVar10 = (int)uVar17;
      if ((char)uVar17 == '\0') goto LAB_0013e60d;
      bVar39 = iVar31 == 0;
      iVar31 = iVar31 + -1;
      iVar10 = (int)CONCAT71((int7)((ulong)uVar17 >> 8),bVar39);
      bVar40 = false;
      if (((int)uVar33 < 1) || (!bVar39)) goto LAB_0013e60d;
    } while( true );
  }
  WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  local_7f8 = (VP8LEncoder *)0x0;
LAB_0013e34f:
  VP8LBitWriterWipeOut(&local_788);
  VP8LEncoderDelete(enc);
  VP8LEncoderDelete(local_7f8);
  return (uint)(picture->error_code == VP8_ENC_OK);
LAB_0013e60d:
  if (!bVar40) {
    if (bVar40) {
      return iVar10;
    }
    if (uVar33 != 0) {
      iVar10 = (*pWVar15->Reset)(&local_758);
      if (iVar10 == 0) {
        WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto LAB_0013e34f;
      }
      if (picture->stats != (WebPAuxStats *)0x0) {
        memcpy(&local_ec,picture->stats,0xbc);
      }
      (*pWVar15->Launch)(&local_758);
    }
    (*pWVar15->Execute)(&local_728);
    iVar10 = (*pWVar15->Sync)(&local_728);
    (*pWVar15->End)(&local_728);
    if (uVar33 != 0) {
      iVar31 = (*pWVar15->Sync)(&local_758);
      (*pWVar15->End)(&local_758);
      if ((iVar10 == 0) || (iVar31 == 0)) {
        if (picture->error_code == VP8_ENC_OK) {
          WebPEncodingSetError(picture,local_1f0.error_code);
        }
      }
      else if (local_788.cur + ((long)(local_788.used + 7 >> 3) - (long)local_788.buf) <
               bw_main->cur + ((long)(bw_main->used + 7 >> 3) - (long)bw_main->buf)) {
        VP8LBitWriterSwap(bw_main,&local_788);
        if (picture->stats != (WebPAuxStats *)0x0) {
          memcpy(picture->stats,&local_ec,0xbc);
        }
      }
    }
  }
  goto LAB_0013e34f;
}

Assistant:

int VP8LEncodeStream(const WebPConfig* const config,
                     const WebPPicture* const picture,
                     VP8LBitWriter* const bw_main) {
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  WebPPicture picture_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  if (enc_main == NULL || !VP8LBitWriterInit(&bw_side, 0)) {
    VP8LEncoderDelete(enc_main);
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // Avoid "garbage value" error from Clang's static analysis tool.
  if (!WebPPictureInit(&picture_side)) {
    goto Error;
  }

  // Analyze image (entropy, num_palettes etc)
  if (!EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config = config;
      param->red_and_blue_always_zero = red_and_blue_always_zero;
      if (idx == 0) {
        param->picture = picture;
        param->stats = picture->stats;
        param->bw = bw_main;
        param->enc = enc_main;
      } else {
        // Create a side picture (error_code is not thread-safe).
        if (!WebPPictureView(picture, /*left=*/0, /*top=*/0, picture->width,
                             picture->height, &picture_side)) {
          assert(0);
        }
        picture_side.progress_hook = NULL;  // Progress hook is not thread-safe.
        param->picture = &picture_side;  // No need to free a view afterwards.
        param->stats = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        param->bw = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, &picture_side);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits = enc_main->histo_bits;
        enc_side->predictor_transform_bits =
            enc_main->predictor_transform_bits;
        enc_side->cross_color_transform_bits =
            enc_main->cross_color_transform_bits;
        enc_side->palette_size = enc_main->palette_size;
        memcpy(enc_side->palette, enc_main->palette,
               sizeof(enc_main->palette));
        memcpy(enc_side->palette_sorted, enc_main->palette_sorted,
               sizeof(enc_main->palette_sorted));
        param->enc = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      if (picture->error_code == VP8_ENC_OK) {
        assert(picture_side.error_code != VP8_ENC_OK);
        WebPEncodingSetError(picture, picture_side.error_code);
      }
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  }

 Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return (picture->error_code == VP8_ENC_OK);
}